

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::addGlobalImport(Wasm2JSBuilder *this,Ref ast,Global *import)

{
  Ref r;
  Ref node;
  Ref in_R8;
  IString IVar1;
  IString name;
  
  ensureModuleVar(this,ast,&import->super_Importable);
  r = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,r);
  node = getImportName(this,&import->super_Importable);
  if ((import->type).id == 2) {
    node = makeJsCoercion(node,JS_INT);
  }
  IVar1 = fromName(this,(import->super_Importable).super_Named.name.super_IString.str,Top);
  name.str._M_len = IVar1.str._M_str;
  name.str._M_str = (char *)node.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,(Value *)IVar1.str._M_len,name,in_R8);
  return;
}

Assistant:

void Wasm2JSBuilder::addGlobalImport(Ref ast, Global* import) {
  ensureModuleVar(ast, *import);
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  Ref value = getImportName(*import);
  if (import->type == Type::i32) {
    value = makeJsCoercion(value, JS_INT);
  }
  ValueBuilder::appendToVar(
    theVar, fromName(import->name, NameScope::Top), value);
}